

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.cpp
# Opt level: O2

void __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::MultAdd
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this,
          TPZFMatrix<std::complex<double>_> *x,TPZFMatrix<std::complex<double>_> *y,
          TPZFMatrix<std::complex<double>_> *z,complex<double> alpha,complex<double> beta,int opt)

{
  int64_t rows;
  double dVar1;
  size_t sVar2;
  TPZDohrAssembleList<std::complex<double>_> *this_00;
  TPZFMatrix<std::complex<double>_> *this_01;
  complex<double> *pcVar3;
  complex<double> *pcVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long row;
  int64_t rows_00;
  _List_node_base *p_Var9;
  long lVar10;
  double dVar11;
  complex<double> beta_00;
  TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_> assemblelist;
  TPZDohrAssembleList<std::complex<double>_> *local_268;
  TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_> local_260;
  vector<std::thread,_std::allocator<std::thread>_> AllThreads;
  TPZAutoPointer<TPZFMatrix<std::complex<double>_>_> local_238;
  TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> data;
  TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> v2work
  ;
  TPZFMatrix<std::complex<double>_> v2;
  TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
  v1threaddata;
  TPZSimpleTimer precondi;
  TPZFMatrix<std::complex<double>_> v1;
  
  iVar5 = alpha._M_value._8_4_;
  uVar7 = alpha._M_value._0_8_;
  uVar6 = uVar7 & 0xffffffff;
  if (alpha._M_value._0_4_ == 0) {
    lVar8 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    if (lVar8 == (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)
    goto LAB_0126ce50;
  }
  else {
    lVar8 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
LAB_0126ce50:
    if ((this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow == lVar8)
    goto LAB_0126ce68;
  }
  TPZMatrix<std::complex<double>_>::Error
            ("Operator* <matrices with incompatible dimensions>",(char *)0x0);
LAB_0126ce68:
  lVar8 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  if ((((lVar8 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol) ||
       (lVar8 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol)) ||
      (lVar8 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow,
      lVar8 != (y->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) ||
     (lVar8 != (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<std::complex<double>_>::Error
              ("TPZFMatrix::MultiplyAdd incompatible dimensions\n",(char *)0x0);
  }
  TPZSimpleTimer::TPZSimpleTimer(&precondi);
  rows_00 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  rows = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  beta_00._M_value._8_8_ = uVar7;
  beta_00._M_value._0_8_ = uVar6;
  TPZMatrix<std::complex<double>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<double>_>,y,z,beta_00,iVar5);
  v2.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  v2.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = 0;
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (&v1,rows_00,(x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol,
             (complex<double> *)&v2);
  v2work.fAccessLock.super___mutex_base._M_mutex.__align = 0;
  v2work.fAccessLock.super___mutex_base._M_mutex._8_8_ = 0;
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (&v2,rows,(x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol,
             (complex<double> *)&v2work);
  if (this->fNumThreads < 1) {
    ComputeV1(this,x,&v1);
    ComputeV2(this,x,&v2);
  }
  else {
    std::vector<std::thread,_std::allocator<std::thread>_>::vector
              (&AllThreads,(ulong)(uint)this->fNumThreads + 2,(allocator_type *)&v2work);
    data.fSubStructure.fRef = (TPZReference *)&v1threaddata;
    v1threaddata.fDohrMatrix = this;
    v1threaddata.fInput = x;
    v1threaddata.fOutput = &v1;
    std::thread::
    thread<void*(&)(void*),TPZDohrPrecondThreadV1Data<std::complex<double>,TPZDohrSubstruct<std::complex<double>>>*,void>
              ((thread *)&v2work,
               TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
               ::ComputeV1,
               (TPZDohrPrecondThreadV1Data<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                **)&data);
    std::thread::operator=
              (AllThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start,(thread *)&v2work);
    std::thread::~thread((thread *)&v2work);
    this_00 = (TPZDohrAssembleList<std::complex<double>_> *)operator_new(0xe0);
    sVar2 = (this->fGlobal).
            super__List_base<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
            ._M_impl._M_node._M_size;
    local_260.fRef = (this->fAssemble).fRef;
    LOCK();
    ((local_260.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((local_260.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    TPZDohrAssembleList<std::complex<double>_>::TPZDohrAssembleList
              (this_00,(int)sVar2,&v2,&local_260);
    iVar5 = 0;
    TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_>::TPZAutoPointer
              (&assemblelist,this_00);
    TPZAutoPointer<TPZDohrAssembly<std::complex<double>_>_>::~TPZAutoPointer(&local_260);
    v2work.fWork.
    super__List_base<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&v2work.fWork;
    v2work.fAccessLock.super___mutex_base._M_mutex.__data.__list.__next =
         (__pthread_internal_list *)0x0;
    v2work.fAccessLock.super___mutex_base._M_mutex._16_8_ = 0;
    v2work.fAccessLock.super___mutex_base._M_mutex.__data.__list.__prev =
         (__pthread_internal_list *)0x0;
    v2work.fAccessLock.super___mutex_base._M_mutex.__align = 0;
    v2work.fAccessLock.super___mutex_base._M_mutex._8_8_ = 0;
    v2work.fWork.
    super__List_base<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>_>_>
    ._M_impl._M_node._M_size = 0;
    v2work.fAssemblyStructure = assemblelist;
    LOCK();
    ((assemblelist.fRef)->fCounter).super___atomic_base<int>._M_i =
         ((assemblelist.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    p_Var9 = (_List_node_base *)&this->fGlobal;
    v2work.fWork.
    super__List_base<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         v2work.fWork.
         super__List_base<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var9 = (((_List_base<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_>_>_>
                       *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var9 != (_List_node_base *)&this->fGlobal) {
      this_01 = (TPZFMatrix<std::complex<double>_> *)operator_new(0x90);
      TPZFMatrix<std::complex<double>_>::TPZFMatrix(this_01);
      TPZDohrAssembly<std::complex<double>_>::Extract
                (((this->fAssemble).fRef)->fPointer,iVar5,x,this_01);
      TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::TPZAutoPointer(&local_238,this_01);
      TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
      TPZDohrPrecondV2SubData
                (&data,iVar5,
                 (TPZAutoPointer<TPZDohrSubstruct<std::complex<double>_>_> *)(p_Var9 + 1),&local_238
                );
      TPZAutoPointer<TPZFMatrix<std::complex<double>_>_>::~TPZAutoPointer(&local_238);
      TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
      AddItem(&v2work,&data);
      TPZDohrPrecondV2SubData<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
      ~TPZDohrPrecondV2SubData(&data);
      iVar5 = iVar5 + 1;
    }
    lVar8 = 0x10;
    for (lVar10 = 0; lVar10 < this->fNumThreads; lVar10 = lVar10 + 1) {
      local_268 = (TPZDohrAssembleList<std::complex<double>_> *)&v2work;
      std::thread::
      thread<void*(&)(void*),TPZDohrPrecondV2SubDataList<std::complex<double>,TPZDohrSubstruct<std::complex<double>>>*,void>
                ((thread *)&data,
                 TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                 ::ThreadWork,
                 (TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>
                  **)&local_268);
      std::thread::operator=
                ((thread *)
                 ((long)&((AllThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start)->_M_id)._M_thread + lVar8),
                 (thread *)&data);
      std::thread::~thread((thread *)&data);
      lVar8 = lVar8 + 8;
    }
    local_268 = (assemblelist.fRef)->fPointer;
    std::thread::thread<void*(&)(void*),TPZDohrAssembleList<std::complex<double>>*,void>
              ((thread *)&data,TPZDohrAssembleList<std::complex<double>_>::Assemble,&local_268);
    std::thread::operator=
              (AllThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start + 1,(thread *)&data);
    std::thread::~thread((thread *)&data);
    for (lVar8 = 0; lVar8 < (long)this->fNumThreads + 2; lVar8 = lVar8 + 1) {
      std::thread::join();
    }
    TPZDohrPrecondV2SubDataList<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::
    ~TPZDohrPrecondV2SubDataList(&v2work);
    TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_>::~TPZAutoPointer(&assemblelist);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&AllThreads);
  }
  TPZFMatrix<std::complex<double>_>::operator+=(&v2,&v1.super_TPZMatrix<std::complex<double>_>);
  lVar8 = (x->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  lVar10 = 0;
  if (rows_00 < 1) {
    rows_00 = lVar10;
  }
  if (lVar8 < 1) {
    lVar8 = lVar10;
  }
  for (; lVar10 != lVar8; lVar10 = lVar10 + 1) {
    for (row = 0; rows_00 != row; row = row + 1) {
      pcVar3 = TPZFMatrix<std::complex<double>_>::operator()(&v2,row,lVar10);
      pcVar4 = TPZFMatrix<std::complex<double>_>::operator()(z,row,lVar10);
      dVar11 = *(double *)(pcVar3->_M_value + 8);
      dVar1 = *(double *)(pcVar4->_M_value + 8);
      *(double *)pcVar4->_M_value = *(double *)pcVar4->_M_value + *(double *)pcVar3->_M_value;
      *(double *)(pcVar4->_M_value + 8) = dVar1 + dVar11;
    }
  }
  dVar11 = TPZSimpleTimer::ReturnTimeDouble(&precondi);
  TPZStack<double,_10>::Push(&tempo.fPreCond,dVar11);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&v2);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&v1);
  TPZSimpleTimer::~TPZSimpleTimer(&precondi);
  return;
}

Assistant:

void TPZDohrPrecond<TVar, TSubStruct>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z, const TVar alpha,const TVar beta,const int opt) const {
    
#ifdef USING_TBB
	MultAddTBB(x, y, z, alpha, beta, opt);
	return;
#endif
    
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		this->Error( "Operator* <matrices with incompatible dimensions>" );
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		this->Error ("TPZFMatrix::MultiplyAdd incompatible dimensions\n");
	}
	TPZSimpleTimer precondi; // init of timer
	int64_t rows = this->Rows();
	int64_t cols = this->Cols();
	int64_t c;
	this->PrepareZ(y,z,beta,opt);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		x.Print("x entry vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
		if (loggerv1v2.isDebugEnabled())
		{
			LOGPZ_DEBUG(loggerv1v2, sout.str())
		}
	}
#endif
	TPZFMatrix<TVar> v1(rows,x.Cols(),0.);
	TPZFMatrix<TVar> v2(cols,x.Cols(),0.);
	if(fNumThreads <= 0)
	{
		ComputeV1(x,v1);
		ComputeV2(x,v2);
	}
	else
	{
        std::vector<std::thread> AllThreads(fNumThreads+2);
		TPZDohrPrecondThreadV1Data<TVar,TSubStruct> v1threaddata(this,x,v1);
		
        AllThreads[0] = thread((TPZDohrPrecondThreadV1Data<TVar,TSubStruct>::ComputeV1), &v1threaddata);
		
		TPZAutoPointer<TPZDohrAssembleList<TVar> > assemblelist = new TPZDohrAssembleList<TVar>(fGlobal.size(),v2,this->fAssemble);
		
		TPZDohrPrecondV2SubDataList<TVar,TSubStruct> v2work(assemblelist);
		typename std::list<TPZAutoPointer<TSubStruct> >::const_iterator it;
		
		int isub=0;
		//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
		for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
		{
			TPZFMatrix<TVar> *Residual_local = new TPZFMatrix<TVar>;
			fAssemble->Extract(isub,x,*Residual_local);
			TPZDohrPrecondV2SubData<TVar,TSubStruct> data(isub,*it,Residual_local);
			v2work.AddItem(data);
		}
		
		int i;
		for (i=0; i<fNumThreads; i++) {
            AllThreads[i+2] = std::thread(TPZDohrPrecondV2SubDataList<TVar,TSubStruct>::ThreadWork, &v2work);
		}
		//		v2work.ThreadWork(&v2work);
		AllThreads[1] = thread(TPZDohrAssembleList<TVar>::Assemble,
                               assemblelist.operator->());
		
		for (i=0; i<fNumThreads+2; i++) {
            AllThreads[i].join();
		}
		//		ComputeV2(x,v2);
	}
	v2 += v1;
	
#ifndef MAKEINTERNAL
	isub=0;
	//Criar tarefa que execute a distribuicao de cada elemento do fGlobal
	for(it= fGlobal.begin(); it != fGlobal.end(); it++,isub++)
	{
		TPZFNMatrix<100> v2Expand((*it)->fNEquations,1,0.), v3Expand((*it)->fNEquations,1,0.);
		int64_t neqs = (*it)->fGlobalEqs.NElements();
		TPZFMatrix<TVar> v3_local(neqs,1,0.), v2_local(neqs,1,0.);
		fAssemble->Extract(isub,v2,v2_local);
		int64_t i;
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v2Expand(ind.first,0) += v2_local(i,0);
		}
		
		(*it)->Contribute_v3_local(v2Expand,v3Expand);
		for (i=0;i<neqs;i++)
		{
			std::pair<int,int> ind = (*it)->fGlobalEqs[i];
			v3_local(i,0) += v3Expand(ind.first,0);
		}
#ifdef PZ_LOG
		{
			std::stringstream sout;
			v2Expand.Print("v1+v2 Expand",sout);
			v3Expand.Print("v3 Expand", sout);
			v2_local.Print("v1+v2 local",sout);
			v3_local.Print("v3 local",sout);
			if (logger.isDebugEnabled())
			{
				LOGPZ_DEBUG(logger, sout.str());
			}
		}
#endif
		fAssemble->Assemble(isub,v3_local,v2);
	}
#endif
	// wait task para finalizacao da chamada
	// esperar a versao correta do v1
	/* Sum v1+v2+v3 with z */
    int64_t xcols = x.Cols();
    for (int64_t ic=0; ic<xcols; ic++)
    {
        for (c=0; c<rows; c++) {
            z(c,ic) += v2(c,ic);
        }
    }
	tempo.fPreCond.Push(precondi.ReturnTimeDouble()); // end of timer
}